

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

CompilerCPP * __thiscall spirv_cross::CompilerCPP::compile_abi_cxx11_(CompilerCPP *this)

{
  bool bVar1;
  uint32_t id;
  SPIRFunction *func;
  SPIREntryPoint *pSVar2;
  CompilerCPP *in_RSI;
  Bitset local_68;
  uint32_t local_1c;
  uint32_t pass_count;
  CompilerCPP *this_local;
  
  this_local = this;
  ParsedIR::fixup_reserved_names(&(in_RSI->super_CompilerGLSL).super_Compiler.ir);
  (in_RSI->super_CompilerGLSL).options.es = false;
  (in_RSI->super_CompilerGLSL).options.version = 0x1c2;
  (in_RSI->super_CompilerGLSL).backend.float_literal_suffix = true;
  (in_RSI->super_CompilerGLSL).backend.double_literal_suffix = false;
  (in_RSI->super_CompilerGLSL).backend.long_long_literal_suffix = true;
  (in_RSI->super_CompilerGLSL).backend.uint32_t_literal_suffix = true;
  (in_RSI->super_CompilerGLSL).backend.basic_int_type = "int32_t";
  (in_RSI->super_CompilerGLSL).backend.basic_uint_type = "uint32_t";
  (in_RSI->super_CompilerGLSL).backend.swizzle_is_function = true;
  (in_RSI->super_CompilerGLSL).backend.shared_is_implied = true;
  (in_RSI->super_CompilerGLSL).backend.unsized_array_supported = false;
  (in_RSI->super_CompilerGLSL).backend.explicit_struct_type = true;
  (in_RSI->super_CompilerGLSL).backend.use_initializer_list = true;
  CompilerGLSL::fixup_type_alias(&in_RSI->super_CompilerGLSL);
  CompilerGLSL::reorder_type_alias(&in_RSI->super_CompilerGLSL);
  Compiler::build_function_control_flow_graphs_and_analyze((Compiler *)in_RSI);
  Compiler::update_active_builtins((Compiler *)in_RSI);
  local_1c = 0;
  do {
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::clear(&in_RSI->resource_registrations);
    CompilerGLSL::reset(&in_RSI->super_CompilerGLSL,local_1c);
    StringStream<4096UL,_4096UL>::reset(&(in_RSI->super_CompilerGLSL).buffer);
    (*(in_RSI->super_CompilerGLSL).super_Compiler._vptr_Compiler[0xe])();
    emit_resources(in_RSI);
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&(in_RSI->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
    func = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)in_RSI,id);
    local_68.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_68.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_68.higher._M_h._M_element_count = 0;
    local_68.higher._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_68.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_68.higher._M_h._M_bucket_count = 0;
    local_68.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68.lower = 0;
    local_68.higher._M_h._M_buckets = (__buckets_ptr)0x0;
    Bitset::Bitset(&local_68);
    CompilerGLSL::emit_function(&in_RSI->super_CompilerGLSL,func,&local_68);
    Bitset::~Bitset(&local_68);
    local_1c = local_1c + 1;
    bVar1 = Compiler::is_forcing_recompilation((Compiler *)in_RSI);
  } while (bVar1);
  CompilerGLSL::end_scope_decl(&in_RSI->super_CompilerGLSL);
  CompilerGLSL::end_scope(&in_RSI->super_CompilerGLSL);
  emit_c_linkage(in_RSI);
  pSVar2 = Compiler::get_entry_point((Compiler *)in_RSI);
  ::std::__cxx11::string::operator=((string *)&pSVar2->name,"main");
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  return this;
}

Assistant:

string CompilerCPP::compile()
{
	ir.fixup_reserved_names();

	// Do not deal with ES-isms like precision, older extensions and such.
	options.es = false;
	options.version = 450;
	backend.float_literal_suffix = true;
	backend.double_literal_suffix = false;
	backend.long_long_literal_suffix = true;
	backend.uint32_t_literal_suffix = true;
	backend.basic_int_type = "int32_t";
	backend.basic_uint_type = "uint32_t";
	backend.swizzle_is_function = true;
	backend.shared_is_implied = true;
	backend.unsized_array_supported = false;
	backend.explicit_struct_type = true;
	backend.use_initializer_list = true;

	fixup_type_alias();
	reorder_type_alias();
	build_function_control_flow_graphs_and_analyze();
	update_active_builtins();

	uint32_t pass_count = 0;
	do
	{
		resource_registrations.clear();
		reset(pass_count);

		// Move constructor for this type is broken on GCC 4.9 ...
		buffer.reset();

		emit_header();
		emit_resources();

		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());

		pass_count++;
	} while (is_forcing_recompilation());

	// Match opening scope of emit_header().
	end_scope_decl();
	// namespace
	end_scope();

	// Emit C entry points
	emit_c_linkage();

	// Entry point in CPP is always main() for the time being.
	get_entry_point().name = "main";

	return buffer.str();
}